

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::AbortAssertionExpr::fromSyntax(AcceptOnPropertyExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  Compilation *expr_00;
  ASTContext *context_00;
  PropertyExprSyntax *pPVar2;
  undefined4 extraout_var;
  AbortAssertionExpr *pAVar3;
  sockaddr *in_RSI;
  long in_RDI;
  bool in_stack_0000000e;
  bool in_stack_0000000f;
  ASTContext *in_stack_00000010;
  bool isSync;
  ExpressionSyntax *in_stack_00000018;
  Action action;
  AssertionExpr *expr;
  Expression *cond;
  Compilation *comp;
  undefined4 in_stack_ffffffffffffffc0;
  socklen_t __len;
  short sVar4;
  undefined4 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 uVar8;
  undefined4 uVar9;
  Expression *args;
  
  expr_00 = ASTContext::getCompilation((ASTContext *)0xb61d58);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xb61d6b);
  __len = 0;
  context_00 = (ASTContext *)
               bindExpr(in_stack_00000018,in_stack_00000010,in_stack_0000000f,in_stack_0000000e);
  pPVar2 = not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                     ((not_null<slang::syntax::PropertyExprSyntax_*> *)0xb61d96);
  iVar1 = AssertionExpr::bind((int)pPVar2,in_RSI,__len);
  args = (Expression *)CONCAT44(extraout_var,iVar1);
  sVar4 = *(short *)(in_RDI + 0x18);
  if (sVar4 == 0x5d) {
    uVar9 = 0;
    uVar8 = 0;
  }
  else if (sVar4 == 0x102) {
    uVar9 = 1;
    uVar8 = 0;
  }
  else if (sVar4 == 0x125) {
    uVar9 = 0;
    uVar8 = 1;
  }
  else {
    uVar9 = 1;
    uVar8 = 1;
  }
  uVar6 = 8;
  uVar7 = 0x33;
  uVar5 = 0x340008;
  AssertionExpr::checkSampledValueExpr
            ((Expression *)expr_00,context_00,SUB41((uint)extraout_var >> 0x18,0),
             SUB84((ulong)in_RSI >> 0x20,0),SUB84(in_RSI,0));
  pAVar3 = BumpAllocator::
           emplace<slang::ast::AbortAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&,slang::ast::AbortAssertionExpr::Action&,bool&>
                     ((BumpAllocator *)context_00,args,
                      (AssertionExpr *)
                      CONCAT44(uVar9,CONCAT13(uVar8,CONCAT12(in_stack_ffffffffffffffd2,uVar7))),
                      (Action *)CONCAT26(uVar6,CONCAT42(uVar5,sVar4)),
                      (bool *)CONCAT44(__len,in_stack_ffffffffffffffc0));
  return &pAVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& AbortAssertionExpr::fromSyntax(const AcceptOnPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& cond = bindExpr(*syntax.condition, context);
    auto& expr = bind(*syntax.expr, context);

    Action action;
    bool isSync;
    switch (syntax.keyword.kind) {
        case TokenKind::AcceptOnKeyword:
            action = Accept;
            isSync = false;
            break;
        case TokenKind::SyncAcceptOnKeyword:
            action = Accept;
            isSync = true;
            break;
        case TokenKind::RejectOnKeyword:
            action = Reject;
            isSync = false;
            break;
        case TokenKind::SyncRejectOnKeyword:
            action = Reject;
            isSync = true;
            break;
        default:
            SLANG_UNREACHABLE;
    }

    checkSampledValueExpr(cond, context, false, diag::PropAbortLocalVar, diag::PropAbortMatched);

    return *comp.emplace<AbortAssertionExpr>(cond, expr, action, isSync);
}